

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_PreEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  int iVar7;
  char *pcVar8;
  TemplateDictionaryPeer peer;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_158,"TestPreEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_158,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"easy PRE");
  ctemplate::TemplateString::TemplateString(&local_b8,"foo");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  TVar4.length_ = local_b8.length_;
  TVar4.ptr_ = local_b8.ptr_;
  TVar4.is_immutable_ = local_b8.is_immutable_;
  TVar4._17_7_ = local_b8._17_7_;
  TVar4.id_ = local_b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar4,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"harder PRE");
  ctemplate::TemplateString::TemplateString(&local_f8,"foo & bar");
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  TVar5.length_ = local_f8.length_;
  TVar5.ptr_ = local_f8.ptr_;
  TVar5.is_immutable_ = local_f8.is_immutable_;
  TVar5._17_7_ = local_f8._17_7_;
  TVar5.id_ = local_f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar5,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_118,"hardest PRE");
  ctemplate::TemplateString::TemplateString(&local_138," \"--\v--\f--\n--\t--&--<-->--\'--\"");
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  TVar6.length_ = local_138.length_;
  TVar6.ptr_ = local_138.ptr_;
  TVar6.is_immutable_ = local_138.is_immutable_;
  TVar6._17_7_ = local_138._17_7_;
  TVar6.id_ = local_138.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar6,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_158,"easy PRE");
  pcVar8 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_158);
  iVar7 = strcmp(pcVar8,"foo");
  if (iVar7 == 0) {
    ctemplate::TemplateString::TemplateString(&local_158,"harder PRE");
    pcVar8 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_158);
    iVar7 = strcmp(pcVar8,"foo &amp; bar");
    if (iVar7 == 0) {
      ctemplate::TemplateString::TemplateString(&local_158,"hardest PRE");
      pcVar8 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_158);
      iVar7 = strcmp(pcVar8," &quot;--\v--\f--\n--\t--&amp;--&lt;--&gt;--&#39;--&quot;");
      if (iVar7 == 0) {
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        return;
      }
      pcVar8 = 
      "strcmp(peer.GetSectionValue(\"hardest PRE\"), \" &quot;--\\v--\\f--\\n--\\t--&amp;--&lt;--&gt;--&#39;--&quot;\") == 0"
      ;
    }
    else {
      pcVar8 = "strcmp(peer.GetSectionValue(\"harder PRE\"), \"foo &amp; bar\") == 0";
    }
  }
  else {
    pcVar8 = "strcmp(peer.GetSectionValue(\"easy PRE\"), \"foo\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar8);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, PreEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestPreEscape", NULL);
  dict.SetEscapedValue("easy PRE", "foo",
                       GOOGLE_NAMESPACE::pre_escape);
  dict.SetEscapedValue("harder PRE", "foo & bar",
                       GOOGLE_NAMESPACE::pre_escape);
  dict.SetEscapedValue("hardest PRE",
                       " \"--\v--\f--\n--\t--&--<-->--'--\"",
                       GOOGLE_NAMESPACE::pre_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy PRE"), "foo");
  EXPECT_STREQ(peer.GetSectionValue("harder PRE"), "foo &amp; bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest PRE"),
               " &quot;--\v--\f--\n--\t--&amp;--&lt;--&gt;--&#39;--&quot;");
}